

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

IXML_Node * ixmlNode_getLastChild(IXML_Node *nodeptr)

{
  Nodeptr local_28;
  IXML_Node *next;
  IXML_Node *prev;
  IXML_Node *nodeptr_local;
  
  if (nodeptr == (IXML_Node *)0x0) {
    nodeptr_local = (IXML_Node *)0x0;
  }
  else {
    next = nodeptr;
    for (local_28 = nodeptr->firstChild; local_28 != (Nodeptr)0x0; local_28 = local_28->nextSibling)
    {
      next = local_28;
    }
    nodeptr_local = next;
  }
  return nodeptr_local;
}

Assistant:

IXML_Node *ixmlNode_getLastChild(IXML_Node *nodeptr)
{
	IXML_Node *prev;
	IXML_Node *next;

	if (nodeptr != NULL) {
		prev = nodeptr;
		next = nodeptr->firstChild;
		while (next != NULL) {
			prev = next;
			next = next->nextSibling;
		}
		return prev;
	} else {
		return NULL;
	}
}